

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

BasicBlock * __thiscall
spvtools::opt::IRContext::get_instr_block(IRContext *this,Instruction *instr)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  BasicBlock *pBVar3;
  ulong uVar4;
  __hash_code __code;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  if ((this->valid_analyses_ & kAnalysisInstrToBlockMapping) == kAnalysisNone) {
    BuildInstrToBlockMapping(this);
  }
  uVar1 = (this->instr_to_block_)._M_h._M_bucket_count;
  uVar4 = (ulong)instr % uVar1;
  p_Var5 = (this->instr_to_block_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Instruction *)p_Var5->_M_nxt[1]._M_nxt != instr)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Instruction *)p_Var2[1]._M_nxt == instr)) goto LAB_0052dd2f;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0052dd2f:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var6->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    pBVar3 = (BasicBlock *)0x0;
  }
  else {
    pBVar3 = (BasicBlock *)p_Var2[2]._M_nxt;
  }
  return pBVar3;
}

Assistant:

BasicBlock* get_instr_block(Instruction* instr) {
    if (!AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
      BuildInstrToBlockMapping();
    }
    auto entry = instr_to_block_.find(instr);
    return (entry != instr_to_block_.end()) ? entry->second : nullptr;
  }